

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jchuff.c
# Opt level: O1

boolean encode_mcu_gather(j_compress_ptr cinfo,JBLOCKROW *MCU_data)

{
  ushort uVar1;
  jpeg_entropy_encoder *pjVar2;
  JBLOCKROW paJVar3;
  _func_boolean_j_compress_ptr_JBLOCKROW_ptr *p_Var4;
  _func_void_j_compress_ptr *p_Var5;
  int *piVar6;
  jpeg_error_mgr *pjVar7;
  bool bVar8;
  ushort uVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  uint uVar17;
  int iVar18;
  
  pjVar2 = cinfo->entropy;
  if (cinfo->restart_interval != 0) {
    if (*(int *)&pjVar2[2].encode_mcu == 0) {
      if (0 < cinfo->comps_in_scan) {
        lVar11 = 0;
        do {
          *(undefined4 *)((long)&pjVar2[1].encode_mcu + lVar11 * 4 + 4) = 0;
          lVar11 = lVar11 + 1;
        } while (lVar11 < cinfo->comps_in_scan);
      }
      *(uint *)&pjVar2[2].encode_mcu = cinfo->restart_interval;
    }
    *(int *)&pjVar2[2].encode_mcu = *(int *)&pjVar2[2].encode_mcu + -1;
  }
  if (0 < cinfo->blocks_in_MCU) {
    lVar11 = 0;
    do {
      lVar15 = (long)cinfo->MCU_membership[lVar11];
      paJVar3 = MCU_data[lVar11];
      uVar17 = 0;
      uVar12 = (int)(*paJVar3)[0] - *(int *)((long)&pjVar2[1].encode_mcu + lVar15 * 4 + 4);
      if (uVar12 != 0) {
        uVar10 = -uVar12;
        if (0 < (int)uVar12) {
          uVar10 = uVar12;
        }
        uVar17 = 0;
        uVar14 = (ulong)uVar10;
        do {
          uVar17 = uVar17 + 1;
          uVar14 = uVar14 >> 1;
          bVar8 = 1 < uVar10;
          uVar10 = (uint)uVar14;
        } while (bVar8);
      }
      p_Var4 = (&pjVar2[5].encode_mcu)[cinfo->cur_comp_info[lVar15]->dc_tbl_no];
      p_Var5 = (&pjVar2[6].finish_pass)[cinfo->cur_comp_info[lVar15]->ac_tbl_no];
      uVar12 = cinfo->lim_Se;
      piVar6 = cinfo->natural_order;
      if (0xb < uVar17) {
        pjVar7 = cinfo->err;
        pjVar7->msg_code = 6;
        (*pjVar7->error_exit)((j_common_ptr)cinfo);
      }
      *(long *)(p_Var4 + (ulong)uVar17 * 8) = *(long *)(p_Var4 + (ulong)uVar17 * 8) + 1;
      if (0 < (int)uVar12) {
        iVar18 = 0;
        lVar16 = 1;
        do {
          uVar1 = (*paJVar3)[piVar6[lVar16]];
          if (uVar1 == 0) {
            iVar18 = iVar18 + 1;
          }
          else {
            if (0xf < iVar18) {
              iVar13 = 0x1f;
              if (iVar18 < 0x1f) {
                iVar13 = iVar18;
              }
              uVar17 = (iVar18 - iVar13) + 0xf;
              iVar18 = (iVar18 - (uVar17 & 0xfffffff0)) + -0x10;
              *(ulong *)(p_Var5 + 0x780) = (ulong)(uVar17 >> 4) + *(long *)(p_Var5 + 0x780) + 1;
            }
            uVar9 = -uVar1;
            if (0 < (short)uVar1) {
              uVar9 = uVar1;
            }
            uVar17 = 1;
            if (1 < uVar9) {
              uVar14 = (ulong)uVar9;
              uVar10 = (uint)uVar9;
              do {
                uVar14 = uVar14 >> 1;
                uVar17 = uVar17 + 1;
                bVar8 = 3 < uVar10;
                uVar10 = (uint)uVar14;
              } while (bVar8);
            }
            if (10 < uVar17) {
              pjVar7 = cinfo->err;
              pjVar7->msg_code = 6;
              (*pjVar7->error_exit)((j_common_ptr)cinfo);
            }
            *(long *)(p_Var5 + (long)(int)(uVar17 + iVar18 * 0x10) * 8) =
                 *(long *)(p_Var5 + (long)(int)(uVar17 + iVar18 * 0x10) * 8) + 1;
            iVar18 = 0;
          }
          lVar16 = lVar16 + 1;
        } while (lVar16 != (ulong)uVar12 + 1);
        if (0 < iVar18) {
          *(long *)p_Var5 = *(long *)p_Var5 + 1;
        }
      }
      *(int *)((long)&pjVar2[1].encode_mcu + lVar15 * 4 + 4) = (int)(*MCU_data[lVar11])[0];
      lVar11 = lVar11 + 1;
    } while (lVar11 < cinfo->blocks_in_MCU);
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
encode_mcu_gather (j_compress_ptr cinfo, JBLOCKROW *MCU_data)
{
  huff_entropy_ptr entropy = (huff_entropy_ptr) cinfo->entropy;
  int blkn, ci;
  jpeg_component_info * compptr;

  /* Take care of restart intervals if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0) {
      /* Re-initialize DC predictions to 0 */
      for (ci = 0; ci < cinfo->comps_in_scan; ci++)
	entropy->saved.last_dc_val[ci] = 0;
      /* Update restart state */
      entropy->restarts_to_go = cinfo->restart_interval;
    }
    entropy->restarts_to_go--;
  }

  for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
    ci = cinfo->MCU_membership[blkn];
    compptr = cinfo->cur_comp_info[ci];
    htest_one_block(cinfo, MCU_data[blkn][0], entropy->saved.last_dc_val[ci],
		    entropy->dc_count_ptrs[compptr->dc_tbl_no],
		    entropy->ac_count_ptrs[compptr->ac_tbl_no]);
    entropy->saved.last_dc_val[ci] = MCU_data[blkn][0][0];
  }

  return TRUE;
}